

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void __thiscall
duckdb::QuantileBindData::QuantileBindData(QuantileBindData *this,QuantileBindData *other)

{
  pointer pQVar1;
  QuantileValue *q;
  pointer __args;
  
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__QuantileBindData_02479ad8;
  (this->quantiles).super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
  super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quantiles).super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
  super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quantiles).super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
  super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&(this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             &(other->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  this->desc = other->desc;
  pQVar1 = (other->quantiles).
           super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
           super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (__args = (other->quantiles).
                super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                _M_impl.super__Vector_impl_data._M_start; __args != pQVar1; __args = __args + 1) {
    ::std::vector<duckdb::QuantileValue,std::allocator<duckdb::QuantileValue>>::
    emplace_back<duckdb::QuantileValue_const&>
              ((vector<duckdb::QuantileValue,std::allocator<duckdb::QuantileValue>> *)
               &this->quantiles,__args);
  }
  return;
}

Assistant:

QuantileBindData::QuantileBindData(const QuantileBindData &other) : order(other.order), desc(other.desc) {
	for (const auto &q : other.quantiles) {
		quantiles.emplace_back(q);
	}
}